

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Vector3f pbrt::SampleHenyeyGreenstein(Vector3f *wo,Float g,Point2f *u,Float *pdf)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  Float FVar4;
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  Vector3f VVar10;
  Tuple3<pbrt::Vector3,_float> TVar11;
  Frame wFrame;
  Float local_70;
  Tuple3<pbrt::Vector3,_float> local_40;
  Frame local_34;
  
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = g;
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar5 = auVar6._0_16_;
  auVar3 = vandps_avx512vl(auVar5,auVar3);
  if (0.001 <= auVar3._0_4_) {
    auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(g + 1.0)),ZEXT416((uint)(g + g)),
                              ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x));
    auVar2 = vfnmadd213ss_fma(auVar5,auVar5,SUB6416(ZEXT464(0x3f800000),0));
    auVar3 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar5,auVar5);
    auVar9._0_4_ = auVar2._0_4_ / auVar9._0_4_;
    auVar9._4_12_ = auVar2._4_12_;
    auVar3 = vfnmadd231ss_fma(auVar3,auVar9,auVar9);
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar3 = vxorps_avx512vl(auVar3,auVar5);
    local_70 = auVar3._0_4_ / (g + g);
  }
  else {
    auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                             ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x),
                             ZEXT416(0x3f800000));
    local_70 = auVar3._0_4_;
  }
  auVar3 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_70),
                            ZEXT416((uint)local_70));
  auVar3 = vmaxss_avx(auVar3,ZEXT816(0));
  auVar3 = vsqrtss_avx(auVar3,auVar3);
  fVar1 = (u->super_Tuple2<pbrt::Point2,_float>).y;
  Frame::FromZ(&local_34,wo);
  auVar8 = (undefined1  [56])0x0;
  VVar10 = SphericalDirection(auVar3._0_4_,local_70,fVar1 * 6.2831855);
  local_40.z = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar8;
  local_40._0_8_ = vmovlps_avx(auVar7._0_16_);
  TVar11 = (Tuple3<pbrt::Vector3,_float>)Frame::FromLocal(&local_34,(Vector3f *)&local_40);
  if (pdf != (Float *)0x0) {
    FVar4 = HenyeyGreenstein(local_70,g);
    *pdf = FVar4;
  }
  return (Vector3f)TVar11;
}

Assistant:

Vector3f SampleHenyeyGreenstein(const Vector3f &wo, Float g, const Point2f &u,
                                Float *pdf) {
    // Compute $\cos \theta$ for Henyey--Greenstein sample
    Float cosTheta;
    if (std::abs(g) < 1e-3)
        cosTheta = 1 - 2 * u[0];
    else {
        Float sqrTerm = (1 - g * g) / (1 + g - 2 * g * u[0]);
        cosTheta = -(1 + g * g - sqrTerm * sqrTerm) / (2 * g);
    }

    // Compute direction _wi_ for Henyey--Greenstein sample
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Float phi = 2 * Pi * u[1];
    Frame wFrame = Frame::FromZ(wo);
    Vector3f wi = wFrame.FromLocal(SphericalDirection(sinTheta, cosTheta, phi));

    if (pdf)
        *pdf = HenyeyGreenstein(cosTheta, g);
    return wi;
}